

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O0

int TeleportGetNumBuffered(int stream)

{
  int iVar1;
  SharedMemoryHandle *this;
  SharedMemory *pSVar2;
  Stream *s;
  int stream_local;
  
  this = Teleport::GetSharedMemory();
  pSVar2 = Teleport::SharedMemoryHandle::operator->(this);
  iVar1 = Teleport::Stream::GetNumBuffered(pSVar2->streams + stream);
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportGetNumBuffered(int stream)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    return s.GetNumBuffered();
}